

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_20b0ad::WriterThread::run(WriterThread *this)

{
  lock_guard<std::mutex> *in_RDI;
  double dVar1;
  int n;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffdc;
  Rand48 *in_stack_ffffffffffffffe0;
  
  while( true ) {
    std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
    if ((anonymous_namespace)::remainingScanlines == 0) {
      iVar2 = 3;
    }
    else {
      in_stack_ffffffffffffffc8 =
           (mutex_type *)
           Imath_3_2::Rand48::nextf
                     (in_stack_ffffffffffffffe0,
                      (double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      (double)in_RDI);
      dVar1 = (double)in_stack_ffffffffffffffc8 + 0.5;
      Imf_3_2::RgbaOutputFile::writePixels((int)in_RDI[2]._M_device);
      (anonymous_namespace)::remainingScanlines =
           (anonymous_namespace)::remainingScanlines - (int)dVar1;
      iVar2 = 0;
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21cd42);
    if (iVar2 != 0) break;
    in_stack_ffffffffffffffd8 = 0;
  }
  IlmThread_3_2::Semaphore::post();
  return;
}

Assistant:

void
WriterThread::run ()
{

    while (true)
    {
        std::lock_guard<std::mutex> lock (scanlineMutex);

        if (remainingScanlines)
        {
            int n = int (rand1.nextf (0.0f, remainingScanlines) + 0.5f);
            _outfile->writePixels (n);
            remainingScanlines -= n;
        }
        else
        {
            break;
        }
    }

    //
    // Signal that the thread has finished
    //

    threadSemaphore.post ();
}